

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::flush_cache(torrent *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  bool local_81;
  enable_shared_from_this<libtorrent::aux::torrent> local_80;
  code *local_70;
  undefined8 local_68;
  type local_60;
  function<void_()> local_38;
  uint local_14;
  torrent *local_10;
  torrent *this_local;
  
  local_10 = this;
  bVar1 = storage_holder::operator_cast_to_bool(&this->m_storage);
  if (bVar1) {
    iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [4])();
    local_14 = (uint)storage_holder::operator_cast_to_strong_typedef(&this->m_storage);
    local_70 = on_cache_flushed;
    local_68 = 0;
    ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this(&local_80);
    local_81 = true;
    ::std::
    bind<void(libtorrent::aux::torrent::*)(bool),std::shared_ptr<libtorrent::aux::torrent>,bool>
              (&local_60,(offset_in_torrent_to_subr *)&local_70,
               (shared_ptr<libtorrent::aux::torrent> *)&local_80,&local_81);
    ::std::function<void()>::
    function<std::_Bind<void(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,bool))(bool)>,void>
              ((function<void()> *)&local_38,&local_60);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x38))
              ((long *)CONCAT44(extraout_var,iVar2),local_14,&local_38);
    ::std::function<void_()>::~function(&local_38);
    ::std::
    _Bind<void_(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,_bool))(bool)>
    ::~_Bind(&local_60);
    ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
              ((shared_ptr<libtorrent::aux::torrent> *)&local_80);
    (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x1f])
              ();
  }
  return;
}

Assistant:

void torrent::flush_cache()
	{
		TORRENT_ASSERT(is_single_thread());

		// storage may be nullptr during shutdown
		if (!m_storage)
		{
			TORRENT_ASSERT(m_abort);
			return;
		}
		m_ses.disk_thread().async_release_files(m_storage
			, std::bind(&torrent::on_cache_flushed, shared_from_this(), true));
		m_ses.deferred_submit_jobs();
	}